

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O1

void s2shapeutil::InitLoopError
               (Code code,char *format,ChainPosition ap,ChainPosition bp,bool is_polygon,
               S2Error *error)

{
  pointer pcVar1;
  undefined7 in_register_00000081;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  S2Error::Init(error,code,format,(ulong)ap >> 0x20,(ulong)bp >> 0x20);
  if ((int)CONCAT71(in_register_00000081,is_polygon) != 0) {
    pcVar1 = (error->text_)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + (error->text_)._M_string_length);
    S2Error::Init(error,code,"Loop %d: %s",(ulong)ap & 0xffffffff,local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return;
}

Assistant:

static void InitLoopError(S2Error::Code code, const char* format,
                          ChainPosition ap, ChainPosition bp,
                          bool is_polygon, S2Error* error) {
  error->Init(code, format, ap.offset, bp.offset);
  if (is_polygon) {
    error->Init(code, "Loop %d: %s", ap.chain_id, error->text().c_str());
  }
}